

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::AsyncHostOperationEnd(ThreadContext *this,bool wasInAsync,void *suspendRecord)

{
  ScriptEntryExitRecord *pSVar1;
  code *pcVar2;
  ScriptEntryExitRecord SVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xfea,"(!this->IsScriptActive())","!this->IsScriptActive()");
    if (!bVar4) goto LAB_007c182d;
    *puVar5 = 0;
  }
  pSVar1 = this->entryExitRecord;
  if (pSVar1 != (ScriptEntryExitRecord *)0x0) {
    SVar3 = *pSVar1;
    if ((undefined1  [56])((undefined1  [56])SVar3 & (undefined1  [56])0x8) == (undefined1  [56])0x0
       ) {
      if ((undefined1  [56])((undefined1  [56])SVar3 & (undefined1  [56])0x10) ==
          (undefined1  [56])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0xff0,"(lastRecord->leaveForAsyncHostOperation)",
                           "lastRecord->leaveForAsyncHostOperation");
        if (!bVar4) {
LAB_007c182d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      *(byte *)pSVar1 = *(byte *)pSVar1 & 0xef | wasInAsync << 4;
      Js::ScriptContext::ProfileResume(pSVar1->scriptContext,(SuspendRecord *)suspendRecord);
      return;
    }
    if ((undefined1  [56])((undefined1  [56])SVar3 & (undefined1  [56])0x10) !=
        (undefined1  [56])0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xffa,"(!lastRecord->leaveForAsyncHostOperation)",
                         "!lastRecord->leaveForAsyncHostOperation");
      if (!bVar4) goto LAB_007c182d;
      *puVar5 = 0;
    }
    if (wasInAsync) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xffb,"(!wasInAsync)","!wasInAsync");
      if (!bVar4) goto LAB_007c182d;
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void
ThreadContext::AsyncHostOperationEnd(bool wasInAsync, void * suspendRecord)
{
    Assert(!this->IsScriptActive());
    Js::ScriptEntryExitRecord * lastRecord = this->entryExitRecord;
    if (lastRecord != NULL)
    {
        if (!lastRecord->leaveForHost)
        {
            Assert(lastRecord->leaveForAsyncHostOperation);
#if DBG
            lastRecord->leaveForAsyncHostOperation = wasInAsync;
#endif
#ifdef PROFILE_EXEC
            lastRecord->scriptContext->ProfileResume((Js::Profiler::SuspendRecord *)suspendRecord);
#endif
        }
        else
        {
            Assert(!lastRecord->leaveForAsyncHostOperation);
            Assert(!wasInAsync);
        }
    }
}